

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thread-capture.h
# Opt level: O0

void __thiscall
capture_thread::ThreadCapture<LogText>::AutoThreadCrosser::ReconstructContextAndCall
          (AutoThreadCrosser *this,function<void_()> *call,ReverseScope *reverse_scope)

{
  long *plVar1;
  bool bVar2;
  long in_RDX;
  undefined8 in_RSI;
  ScopedCrosser *in_RDI;
  DelegateCrosser crosser;
  ThreadCrosser *current;
  CrossThreads capture;
  function<void_()> *in_stack_ffffffffffffffc0;
  
  CrossThreads::CrossThreads((CrossThreads *)in_stack_ffffffffffffffc0,(ScopedCapture *)in_RDI);
  if (*(long *)(in_RDX + 8) == 0) {
    ThreadCrosser::DelegateCrosser::DelegateCrosser
              ((DelegateCrosser *)in_stack_ffffffffffffffc0,in_RDI);
    bVar2 = std::function::operator_cast_to_bool(in_stack_ffffffffffffffc0);
    if (!bVar2) {
      __assert_fail("call",
                    "/workspace/llm4binary/github/license_c_cmakelists/google[P]capture-thread/include/thread-capture.h"
                    ,0xd0,
                    "virtual void capture_thread::ThreadCapture<LogText>::AutoThreadCrosser::ReconstructContextAndCall(const std::function<void ()> &, const ReverseScope &) const [Type = LogText]"
                   );
    }
    bVar2 = std::function::operator_cast_to_bool(in_stack_ffffffffffffffc0);
    if (bVar2) {
      std::function<void_()>::operator()(in_stack_ffffffffffffffc0);
    }
    ThreadCrosser::DelegateCrosser::~DelegateCrosser((DelegateCrosser *)0x10a8a7);
  }
  else {
    plVar1 = (long *)**(long **)(in_RDX + 8);
    if (plVar1 == (long *)0x0) {
      __assert_fail("current",
                    "/workspace/llm4binary/github/license_c_cmakelists/google[P]capture-thread/include/thread-capture.h"
                    ,200,
                    "virtual void capture_thread::ThreadCapture<LogText>::AutoThreadCrosser::ReconstructContextAndCall(const std::function<void ()> &, const ReverseScope &) const [Type = LogText]"
                   );
    }
    if (plVar1 != (long *)0x0) {
      (**(code **)(*plVar1 + 0x18))(plVar1,in_RSI,*(undefined8 *)(in_RDX + 8));
    }
  }
  CrossThreads::~CrossThreads((CrossThreads *)0x10a8b1);
  return;
}

Assistant:

void ThreadCapture<Type>::AutoThreadCrosser::ReconstructContextAndCall(
    const std::function<void()>& call,
    const ReverseScope& reverse_scope) const {
  // Makes the ThreadCapture available in this scope so that it overrides the
  // default behavior of instrumentation calls made in call.
  const CrossThreads capture(capture_to_);
  if (reverse_scope.previous) {
    const auto current = reverse_scope.previous->current;
    assert(current);
    if (current) {
      current->ReconstructContextAndCall(call, *reverse_scope.previous);
    }
  } else {
    // Makes the ThreadCrosser available in this scope so that call itself can
    // cross threads again.
    const DelegateCrosser crosser(cross_with_);
    assert(call);
    if (call) {
      call();
    }
  }
}